

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase333::run(TestCase333 *this)

{
  StructSchema SVar1;
  StructSchema SVar2;
  Schema SVar3;
  Type TVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  Field basic;
  StructSchema branded;
  Field foo;
  StructSchema unbound;
  StructSchema inner2;
  StructSchema instance2;
  StructSchema schema;
  SchemaLoader loader;
  StructSchema results;
  Field foo2;
  StructSchema bound_1;
  Field local_140;
  Schema local_100;
  undefined1 local_f8 [64];
  Schema local_b8;
  Type local_b0;
  Schema local_a0;
  Schema local_98;
  SchemaLoader local_90;
  Schema local_68;
  undefined1 local_60 [64];
  Schema local_20;
  
  local_f8._8_8_ = local_f8._0_8_;
  local_60._8_8_ = local_60._0_8_;
  SchemaLoader::SchemaLoader(&local_90);
  local_60._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_60);
  local_f8._0_8_ = SchemaLoader::load(&local_90,(Reader *)&local_140);
  SVar1 = Schema::asStruct((Schema *)local_f8);
  local_60._0_8_ = &PTR_s_e3da5a2ccd28c0d8_00613430;
  Schema::getProto((Reader *)&local_140,(Schema *)local_60);
  local_f8._0_8_ = SchemaLoader::load(&local_90,(Reader *)&local_140);
  SVar2 = Schema::asStruct((Schema *)local_f8);
  local_f8._0_8_ = schemas::s_f6a841117e19ac73 + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_f8);
  SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_f8._0_8_ = schemas::s_a9ab42b118d6d435 + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_f8);
  SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_f8._0_8_ = schemas::s_c9e749e8dd54da5c + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_f8);
  SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_f8._0_8_ = schemas::s_a5b46224e33581ad + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_f8);
  SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_f8._0_8_ = schemas::s_9d5b8cd8de9922eb + 0x48;
  Schema::getProto((Reader *)&local_140,(Schema *)local_f8);
  SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_60._0_8_ = 0x615de0;
  Schema::getProto((Reader *)&local_140,(Schema *)local_60);
  local_f8._0_8_ = SchemaLoader::load(&local_90,(Reader *)&local_140);
  local_98.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)local_f8);
  local_100.raw = (RawBrandedSchema *)(NULL_STRUCT_SCHEMA + 0x48);
  name.content.size_ = 6;
  name.content.ptr = "basic";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_98,name);
  local_f8._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  local_100.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_f8);
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_100,name_00);
  local_60._0_16_ = (undefined1  [16])StructSchema::Field::getType((Field *)local_f8);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_60);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x160,ERROR,"\"failed: expected \" \"foo.getType().asStruct() == allTypes\"",
               (char (*) [54])"failed: expected foo.getType().asStruct() == allTypes");
  }
  local_60._0_16_ = (undefined1  [16])StructSchema::Field::getType((Field *)local_f8);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_60);
  if (((Schema)SVar3.raw == SVar2.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x161,ERROR,"\"failed: expected \" \"foo.getType().asStruct() != tap\"",
               (char (*) [49])"failed: expected foo.getType().asStruct() != tap");
  }
  name_01.content.size_ = 4;
  name_01.content.ptr = "rev";
  StructSchema::getFieldByName((Field *)local_60,(StructSchema *)&local_100,name_01);
  local_b0 = StructSchema::Field::getType((Field *)local_60);
  local_a0.raw = (RawBrandedSchema *)Type::asStruct(&local_b0);
  name_02.content.size_ = 4;
  name_02.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_60,(StructSchema *)&local_a0,name_02);
  local_b0 = StructSchema::Field::getType((Field *)local_60);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct(&local_b0);
  if (((Schema)SVar3.raw != SVar2.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x165,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() == tap\"",
               (char (*) [50])"failed: expected foo2.getType().asStruct() == tap");
  }
  local_b0 = StructSchema::Field::getType((Field *)local_60);
  SVar3.raw = (RawBrandedSchema *)Type::asStruct(&local_b0);
  if (((Schema)SVar3.raw == SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x166,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() != allTypes\"",
               (char (*) [55])"failed: expected foo2.getType().asStruct() != allTypes");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "inner2";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_98,name_03);
  local_f8._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  SVar2 = Type::asStruct((Type *)local_f8);
  local_b0._0_8_ = SVar2.super_Schema.raw;
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "innerBound";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_b0,name_04);
  local_f8._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  local_a0.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_f8);
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_a0,name_05);
  local_f8._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  if (((local_f8._0_4_ & 0xffffff) == 0x12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x16e,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
               (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
  }
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_f8);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x16f,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
               (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
  }
  name_06.content.size_ = 0xd;
  name_06.content.ptr = "innerUnbound";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_b0,name_06);
  local_60._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  local_b8.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_60);
  name_07.content.size_ = 4;
  name_07.content.ptr = "foo";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_b8,name_07);
  TVar4 = StructSchema::Field::getType(&local_140);
  if (((TVar4._0_4_ & 0xffffff) != 0x12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x173,ERROR,"\"failed: expected \" \"unboundFoo.isAnyPointer()\"",
               (char (*) [43])"failed: expected unboundFoo.isAnyPointer()");
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "genericCap";
  StructSchema::getFieldByName(&local_140,(StructSchema *)&local_98,name_08);
  local_f8._0_16_ = (undefined1  [16])StructSchema::Field::getType(&local_140);
  local_a0.raw = (RawBrandedSchema *)Type::asInterface((Type *)local_f8);
  name_09.content.size_ = 5;
  name_09.content.ptr = "call";
  InterfaceSchema::getMethodByName((Method *)&local_140,(InterfaceSchema *)&local_a0,name_09);
  local_b8.raw = (RawBrandedSchema *)InterfaceSchema::Method::getParamType((Method *)&local_140);
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "innerBound";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_b8,name_10);
  local_60._0_16_ = (undefined1  [16])StructSchema::Field::getType((Field *)local_f8);
  local_20.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_60);
  name_11.content.size_ = 4;
  name_11.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_20,name_11);
  local_60._0_16_ = (undefined1  [16])StructSchema::Field::getType((Field *)local_f8);
  if (((local_60._0_4_ & 0xffffff) == 0x12) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17d,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
               (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
  }
  SVar3.raw = (RawBrandedSchema *)Type::asStruct((Type *)local_60);
  if (((Schema)SVar3.raw != SVar1.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17e,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
               (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
  }
  name_12.content.size_ = 4;
  name_12.content.ptr = "baz";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_b8,name_12);
  TVar4 = StructSchema::Field::getType((Field *)local_f8);
  if (((TVar4._0_4_ & 0xffffff) != 0xc) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x17f,ERROR,
               "\"failed: expected \" \"inner2.getFieldByName(\\\"baz\\\").getType().isText()\"",
               (char (*) [65])"failed: expected inner2.getFieldByName(\"baz\").getType().isText()");
  }
  local_68.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType((Method *)&local_140);
  name_13.content.size_ = 4;
  name_13.content.ptr = "qux";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_68,name_13);
  TVar4 = StructSchema::Field::getType((Field *)local_f8);
  if (((TVar4._0_4_ & 0xffffff) != 0xd) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x182,ERROR,
               "\"failed: expected \" \"results.getFieldByName(\\\"qux\\\").getType().isData()\"",
               (char (*) [66])"failed: expected results.getFieldByName(\"qux\").getType().isData()")
    ;
  }
  name_14.content.size_ = 4;
  name_14.content.ptr = "gen";
  StructSchema::getFieldByName((Field *)local_f8,(StructSchema *)&local_68,name_14);
  local_b0 = StructSchema::Field::getType((Field *)local_f8);
  SVar1 = Type::asStruct(&local_b0);
  if ((SVar1.super_Schema.raw != (Schema)local_100.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[79]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x184,ERROR,
               "\"failed: expected \" \"results.getFieldByName(\\\"gen\\\").getType().asStruct() == branded\""
               ,(char (*) [79])
                "failed: expected results.getFieldByName(\"gen\").getType().asStruct() == branded");
  }
  SchemaLoader::~SchemaLoader(&local_90);
  return;
}

Assistant:

TEST(SchemaLoader, Generics) {
  SchemaLoader loader;

  StructSchema allTypes = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();
  StructSchema tap = loader.load(Schema::from<test::TestAnyPointer>().getProto()).asStruct();
  loader.load(Schema::from<test::TestGenerics<>::Inner>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Inner2<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>::CallResults>().getProto());
  loader.load(Schema::from<test::TestGenerics<>>().getProto());
  StructSchema schema = loader.load(Schema::from<test::TestUseGenerics>().getProto()).asStruct();

  StructSchema branded;

  {
    StructSchema::Field basic = schema.getFieldByName("basic");
    branded = basic.getType().asStruct();

    StructSchema::Field foo = branded.getFieldByName("foo");
    EXPECT_TRUE(foo.getType().asStruct() == allTypes);
    EXPECT_TRUE(foo.getType().asStruct() != tap);

    StructSchema instance2 = branded.getFieldByName("rev").getType().asStruct();
    StructSchema::Field foo2 = instance2.getFieldByName("foo");
    EXPECT_TRUE(foo2.getType().asStruct() == tap);
    EXPECT_TRUE(foo2.getType().asStruct() != allTypes);
  }

  {
    StructSchema inner2 = schema.getFieldByName("inner2").getType().asStruct();

    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);

    StructSchema unbound = inner2.getFieldByName("innerUnbound").getType().asStruct();
    Type unboundFoo = unbound.getFieldByName("foo").getType();
    EXPECT_TRUE(unboundFoo.isAnyPointer());
  }

  {
    InterfaceSchema cap = schema.getFieldByName("genericCap").getType().asInterface();
    InterfaceSchema::Method method = cap.getMethodByName("call");

    StructSchema inner2 = method.getParamType();
    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);
    EXPECT_TRUE(inner2.getFieldByName("baz").getType().isText());

    StructSchema results = method.getResultType();
    EXPECT_TRUE(results.getFieldByName("qux").getType().isData());

    EXPECT_TRUE(results.getFieldByName("gen").getType().asStruct() == branded);
  }
}